

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O2

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
::Node::dual_dfs(Node *this,
                vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                *acc)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *local_28;
  
  if (this->visited == false) {
    this->visited = true;
    ppNVar1 = (this->dual_edges).
              super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar2 = (this->dual_edges).
                   super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
        ppNVar2 = ppNVar2 + 1) {
      dual_dfs(*ppNVar2,acc);
    }
    local_28 = this;
    std::
    vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
    ::emplace_back<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>
              ((vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
                *)acc,&local_28);
  }
  return;
}

Assistant:

void dual_dfs(std::vector<const Node *> &acc) const {
            if (visited) return;
            visited = true;
            for (auto i: dual_edges) {
                i->dual_dfs(acc);
            }
            acc.push_back(this);
        }